

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O0

void math::internal::matrix_r_svd<double>
               (double *mat_a,int rows,int cols,double *mat_u,double *vec_s,double *mat_v,
               double *epsilon)

{
  int iVar1;
  double local_90;
  double *local_88;
  double *mat_u_tmp;
  double *mat_r;
  double *mat_q;
  allocator<double> local_59;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> buffer;
  int mat_u_tmp_size;
  int mat_r_size;
  int mat_q_size;
  double *mat_v_local;
  double *vec_s_local;
  double *mat_u_local;
  int cols_local;
  int rows_local;
  double *mat_a_local;
  
  buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = rows * cols;
  iVar1 = rows * rows + rows * cols +
          buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_;
  std::allocator<double>::allocator(&local_59);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_58,(long)iVar1,&local_59);
  std::allocator<double>::~allocator(&local_59);
  mat_r = std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)local_58,0);
  mat_u_tmp = mat_r + rows * rows;
  local_88 = mat_u_tmp + rows * cols;
  matrix_qr<double>(mat_a,rows,cols,mat_r,mat_u_tmp,epsilon);
  matrix_gk_svd<double>(mat_u_tmp,cols,cols,local_88,vec_s,mat_v,epsilon);
  local_90 = 0.0;
  std::fill<double*,double>(local_88 + (uint)(cols * cols),local_88 + rows * cols,&local_90);
  matrix_multiply<double>(mat_r,rows,rows,local_88,cols,mat_u);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  return;
}

Assistant:

void
matrix_r_svd (T const* mat_a, int rows, int cols,
    T* mat_u, T* vec_s, T* mat_v, T const& epsilon)
{
    /* Allocate memory for temp matrices. */
    int const mat_q_size = rows * rows;
    int const mat_r_size = rows * cols;
    int const mat_u_tmp_size = rows * cols;
    std::vector<T> buffer(mat_q_size + mat_r_size + mat_u_tmp_size);
    T* mat_q = &buffer[0];
    T* mat_r = mat_q + mat_q_size;
    T* mat_u_tmp = mat_r + mat_r_size;

    matrix_qr(mat_a, rows, cols, mat_q, mat_r, epsilon);
    matrix_gk_svd(mat_r, cols, cols, mat_u_tmp, vec_s, mat_v, epsilon);
    std::fill(mat_u_tmp + cols * cols, mat_u_tmp + rows * cols, T(0));

    /* Adapt U for big matrices. */
    matrix_multiply(mat_q, rows, rows, mat_u_tmp, cols, mat_u);
}